

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::_::Delimited<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>>,kj::StringPtr&,kj::StringPtr>
          (String *__return_storage_ptr__,_ *this,
          Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_> *params,
          StringPtr *params_1,StringPtr *params_2)

{
  size_t sVar1;
  char *target;
  
  sVar1 = Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_>::size
                    ((Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_> *)this);
  heapString(__return_storage_ptr__,(sVar1 + (params->array).size_ + (params_1->content).size_) - 2)
  ;
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::StringPtr&,kj::StringPtr>
            (target,(Delimited<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_> *)this,
             (StringPtr *)params,params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}